

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenMemoryFill(BinaryenModuleRef module,BinaryenExpressionRef dest,BinaryenExpressionRef value,
                  BinaryenExpressionRef size,char *memoryName)

{
  MemoryFill *pMVar1;
  Name memory;
  Builder local_30;
  
  local_30.wasm = module;
  memory = getMemoryName(module,memoryName);
  pMVar1 = wasm::Builder::makeMemoryFill(&local_30,dest,value,size,memory);
  return (BinaryenExpressionRef)pMVar1;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryFill(BinaryenModuleRef module,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef value,
                                         BinaryenExpressionRef size,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryFill((Expression*)dest,
                      (Expression*)value,
                      (Expression*)size,
                      getMemoryName(module, memoryName)));
}